

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
SMBusSimulationDataGenerator::OutputRecvByte(SMBusSimulationDataGenerator *this,U8 byte)

{
  U8 byte_00;
  byte bVar1;
  bool bVar2;
  byte bVar3;
  U8 pec;
  U8 byte_local;
  SMBusSimulationDataGenerator *this_local;
  
  OutputStart(this);
  bVar1 = OutputAddr(this,'C',true,true);
  bVar1 = ""[(int)(uint)bVar1];
  bVar2 = SMBusAnalyzerSettings::CalcPEC(this->mSettings);
  bVar3 = OutputByte(this,byte,bVar2);
  byte_00 = ""[(int)(uint)(bVar1 ^ bVar3)];
  bVar2 = SMBusAnalyzerSettings::CalcPEC(this->mSettings);
  if (bVar2) {
    OutputByte(this,byte_00,false);
  }
  OutputStop(this);
  AdvanceAllBySec(this,0.0005);
  return;
}

Assistant:

void SMBusSimulationDataGenerator::OutputRecvByte( U8 byte )
{
    U8 pec = 0;

    OutputStart();
    pec = SMBusCRCLookup[ pec ^ OutputAddr( 0x43, true ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( byte, mSettings->CalcPEC() ) ];
    if( mSettings->CalcPEC() )
        OutputByte( pec, false );
    OutputStop();

    AdvanceAllBySec( ONE_MS * 0.5 );
}